

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool testing::internal::UnitTestOptions::PatternMatchesString(char *pattern,char *str)

{
  char cVar1;
  bool bVar2;
  bool local_27;
  bool local_25;
  char *str_local;
  char *pattern_local;
  
  cVar1 = *pattern;
  if (cVar1 != '\0') {
    if (cVar1 == '*') {
      if ((*str != '\0') && (bVar2 = PatternMatchesString(pattern,str + 1), bVar2)) {
        return true;
      }
      bVar2 = PatternMatchesString(pattern + 1,str);
      return bVar2;
    }
    if (cVar1 != ':') {
      if (cVar1 == '?') {
        local_25 = false;
        if (*str != '\0') {
          local_25 = PatternMatchesString(pattern + 1,str + 1);
        }
        return local_25;
      }
      local_27 = false;
      if (*pattern == *str) {
        local_27 = PatternMatchesString(pattern + 1,str + 1);
      }
      return local_27;
    }
  }
  return *str == '\0';
}

Assistant:

bool UnitTestOptions::PatternMatchesString(const char *pattern,
                                           const char *str) {
  switch (*pattern) {
    case '\0':
    case ':':  // Either ':' or '\0' marks the end of the pattern.
      return *str == '\0';
    case '?':  // Matches any single character.
      return *str != '\0' && PatternMatchesString(pattern + 1, str + 1);
    case '*':  // Matches any string (possibly empty) of characters.
      return (*str != '\0' && PatternMatchesString(pattern, str + 1)) ||
          PatternMatchesString(pattern + 1, str);
    default:  // Non-special character.  Matches itself.
      return *pattern == *str &&
          PatternMatchesString(pattern + 1, str + 1);
  }
}